

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcache.c
# Opt level: O3

byte_req_pair memcache_ascii_consume_response(application_protocol *proto,iovec *resp)

{
  ulong uVar1;
  void *pvVar2;
  int iVar3;
  char *pcVar4;
  uint64_t uVar5;
  char *__s1;
  uint64_t uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  byte_req_pair bVar10;
  
  uVar1 = resp->iov_len;
  if ((int)uVar1 < 5) {
    uVar6 = 0;
    uVar5 = 0;
  }
  else {
    pvVar2 = resp->iov_base;
    uVar5 = 0;
    uVar6 = 0;
    uVar8 = uVar1 & 0xffffffff;
    do {
      uVar7 = (uint)uVar8;
      __s1 = (char *)((uVar1 - uVar8) + (long)pvVar2);
      iVar3 = strncmp(__s1,"END\r\n",5);
      if (iVar3 == 0) {
        uVar6 = uVar6 + 5;
        uVar8 = (ulong)(uVar7 - 5);
      }
      else {
        if (uVar7 < 8) break;
        iVar3 = strncmp(__s1,"STORED\r\n",8);
        if (iVar3 == 0) {
          uVar6 = uVar6 + 8;
          uVar8 = (ulong)(uVar7 - 8);
        }
        else {
          pcVar4 = __s1 + -1;
          iVar3 = 2;
          do {
            pcVar4 = strchr(pcVar4 + 1,10);
            bVar9 = iVar3 != 0;
            iVar3 = iVar3 + -1;
            if (pcVar4 == (char *)0x0) break;
          } while (bVar9);
          if (pcVar4 == (char *)0x0) break;
          iVar3 = ((int)pcVar4 - (int)__s1) + 1;
          uVar8 = (ulong)(uVar7 - iVar3);
          uVar6 = uVar6 + (long)iVar3;
        }
      }
      uVar5 = uVar5 + 1;
    } while (4 < (int)uVar8);
  }
  bVar10.reqs = uVar5;
  bVar10.bytes = uVar6;
  return bVar10;
}

Assistant:

static struct byte_req_pair
memcache_ascii_consume_response(struct application_protocol *proto,
								struct iovec *resp)
{
	struct byte_req_pair res;
	int bytes_to_process, get_rep_size;
	char *buf, *ptr;

	res.bytes = 0;
	res.reqs = 0;
	bytes_to_process = resp->iov_len;
	buf = resp->iov_base;

	while (bytes_to_process) {
		if (bytes_to_process < 5) // minimum reply is EDN\r\n
			goto OUT;
		if (strncmp(&buf[resp->iov_len - bytes_to_process], "END\r\n", 5) ==
			0) {
			// key not found
			res.bytes += 5;
			res.reqs += 1;
			bytes_to_process -= 5;
			continue;
		}
		if (bytes_to_process < 8) // try STORED\r\n
			goto OUT;
		if (strncmp(&buf[resp->iov_len - bytes_to_process], "STORED\r\n", 8) ==
			0) {
			// successful set
			res.bytes += 8;
			res.reqs += 1;
			bytes_to_process -= 8;
			continue;
		}
		// try for get reply - look for 3 \n
		ptr = strchnth(&buf[resp->iov_len - bytes_to_process], '\n', 3);
		if (!ptr)
			goto OUT;
		get_rep_size = ptr - &buf[resp->iov_len - bytes_to_process] + 1;
		bytes_to_process -= get_rep_size;
		res.bytes += get_rep_size;
		res.reqs += 1;
	}

OUT:
	return res;
}